

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O2

void __thiscall
feintrack::SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects(SimpleLeftObjectsDetector *this)

{
  int iVar1;
  const_iterator __position;
  
  __position._M_node =
       (this->shady_left_objects).
       super__List_base<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  while (__position._M_node != (_List_node_base *)&this->shady_left_objects) {
    if ((*(int *)((long)&__position._M_node[2]._M_next + 4) == 0) &&
       (iVar1 = *(int *)&__position._M_node[2]._M_prev,
       *(int *)&__position._M_node[2]._M_prev = iVar1 + 1, this->left_object_time1 <= iVar1)) {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
           erase(&this->shady_left_objects,__position);
    }
    else {
      __position._M_node = (__position._M_node)->_M_next;
    }
  }
  return;
}

Assistant:

void SimpleLeftObjectsDetector::AnalyzeShadyLeftObjects()
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end();)
    {
        if (!iter->obj_uid)
        {
            iter->not_detect_time++;
            if (iter->not_detect_time > left_object_time1)
                iter = shady_left_objects.erase(iter);
            else
                ++iter;
        }
        else
        {
            ++iter;
        }
    }
}